

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::PrivkeyHexData,cfd::js::api::json::PrivkeyWifData,cfd::js::api::PrivkeyHexDataStruct,cfd::js::api::PrivkeyWifDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::PrivkeyWifDataStruct_(const_cfd::js::api::PrivkeyHexDataStruct_&)>
          *call_function)

{
  ErrorResponse local_598;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4e0 [4];
  JsonClassBase<cfd::js::api::json::PrivkeyWifData> local_4c0 [4];
  undefined1 local_4a0 [8];
  PrivkeyWifData res_2;
  undefined1 local_440 [8];
  PrivkeyWifDataStruct response;
  PrivkeyHexDataStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a0 [8];
  PrivkeyHexData req;
  function<cfd::js::api::PrivkeyWifDataStruct_(const_cfd::js::api::PrivkeyHexDataStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._120_8_ = call_function;
  PrivkeyHexData::PrivkeyHexData((PrivkeyHexData *)local_a0);
  core::JsonClassBase<cfd::js::api::json::PrivkeyHexData>::Deserialize
            ((JsonClassBase<cfd::js::api::json::PrivkeyHexData> *)local_a0,request_message);
  PrivkeyHexData::ConvertToStruct
            ((PrivkeyHexDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PrivkeyHexData *)local_a0);
  std::function<cfd::js::api::PrivkeyWifDataStruct_(const_cfd::js::api::PrivkeyHexDataStruct_&)>::
  operator()((PrivkeyWifDataStruct *)local_440,call_function,
             (PrivkeyHexDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    PrivkeyWifData::PrivkeyWifData((PrivkeyWifData *)local_4a0);
    PrivkeyWifData::ConvertFromStruct((PrivkeyWifData *)local_4a0,(PrivkeyWifDataStruct *)local_440)
    ;
    core::JsonClassBase<cfd::js::api::json::PrivkeyWifData>::Serialize_abi_cxx11_(local_4c0);
    std::__cxx11::string::operator=((string *)this,(string *)local_4c0);
    std::__cxx11::string::~string((string *)local_4c0);
    PrivkeyWifData::~PrivkeyWifData((PrivkeyWifData *)local_4a0);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_598,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4e0);
    std::__cxx11::string::operator=((string *)this,(string *)local_4e0);
    std::__cxx11::string::~string((string *)local_4e0);
    ErrorResponse::~ErrorResponse(&local_598);
  }
  res_2._87_1_ = 1;
  PrivkeyWifDataStruct::~PrivkeyWifDataStruct((PrivkeyWifDataStruct *)local_440);
  PrivkeyHexDataStruct::~PrivkeyHexDataStruct
            ((PrivkeyHexDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PrivkeyHexData::~PrivkeyHexData((PrivkeyHexData *)local_a0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}